

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMAttrImpl.cpp
# Opt level: O1

DOMNode * __thiscall xercesc_4_0::DOMAttrImpl::cloneNode(DOMAttrImpl *this,bool deep)

{
  DOMDocument *pDVar1;
  int iVar2;
  undefined4 extraout_var;
  DOMAttrImpl *this_00;
  
  pDVar1 = (this->fParent).fOwnerDocument;
  iVar2 = (*(pDVar1->super_DOMNode)._vptr_DOMNode[0x26])
                    (&pDVar1->super_DOMNode,&XMLUni::fgXercescInterfaceDOMMemoryManager,0);
  this_00 = (DOMAttrImpl *)
            (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x28))
                      ((long *)CONCAT44(extraout_var,iVar2),0x70,0);
  DOMAttrImpl(this_00,this,deep);
  DOMNodeImpl::callUserDataHandlers(&this->fNode,NODE_CLONED,(DOMNode *)this,(DOMNode *)this_00);
  return (DOMNode *)this_00;
}

Assistant:

DOMNode * DOMAttrImpl::cloneNode(bool deep) const
{
    DOMNode* newNode = new (fParent.fOwnerDocument, DOMDocumentImpl::ATTR_OBJECT) DOMAttrImpl(*this, deep);
    fNode.callUserDataHandlers(DOMUserDataHandler::NODE_CLONED, this, newNode);
    return newNode;
}